

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.h
# Opt level: O0

void __thiscall absl::lts_20250127::cord_internal::CordRepBtree::AlignEnd(CordRepBtree *this)

{
  size_t sVar1;
  size_t sVar2;
  long lVar3;
  ulong end;
  ulong local_30;
  size_t i;
  size_t new_end;
  size_t new_begin;
  size_t delta;
  CordRepBtree *this_local;
  
  sVar1 = capacity(this);
  sVar2 = CordRepBtree::end(this);
  lVar3 = sVar1 - sVar2;
  if (lVar3 != 0) {
    sVar1 = begin(this);
    sVar2 = CordRepBtree::end(this);
    end = sVar2 + lVar3;
    set_begin(this,sVar1 + lVar3);
    set_end(this,end);
    if (6 < end) {
      __assert_fail("new_end <= kMaxCapacity",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                    ,0x2f5,"void absl::cord_internal::CordRepBtree::AlignEnd()");
    }
    while (local_30 = end - 1, sVar1 + lVar3 <= local_30) {
      *(undefined8 *)((this->super_CordRep).storage + end * 8 + -5) =
           *(undefined8 *)((long)this + (local_30 - lVar3) * 8 + 0x10);
      end = local_30;
    }
  }
  return;
}

Assistant:

inline void CordRepBtree::AlignEnd() {
  // See comments in `AlignBegin` for motivation on the hand-rolled for loops.
  const size_t delta = capacity() - end();
  if (delta != 0) {
    const size_t new_begin = begin() + delta;
    const size_t new_end = end() + delta;
    set_begin(new_begin);
    set_end(new_end);
    ABSL_ASSUME(new_end <= kMaxCapacity);
#ifdef __clang__
#pragma unroll 1
#endif
    for (size_t i = new_end - 1; i >= new_begin; --i) {
      edges_[i] = edges_[i - delta];
    }
  }
}